

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  long *plVar6;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var7;
  uint uVar8;
  size_type *psVar9;
  cmCTestGenericHandler *this_00;
  ulong dindex;
  bool bVar10;
  cmDuration cVar11;
  string fullname;
  Directory d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string notes_dir;
  string local_1f0;
  Directory local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  _Var7._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  lVar4 = 0x1f68;
  do {
    bVar1 = *(byte *)((long)&(_Var7._M_head_impl)->RepeatTests + lVar4);
    if (bVar1 != 0) break;
    bVar10 = lVar4 != 0x2228;
    lVar4 = lVar4 + 0x40;
  } while (bVar10);
  if ((_Var7._M_head_impl)->Parts[1].Enabled == false) {
LAB_0014e9e9:
    bVar10 = false;
    uVar8 = 0;
  }
  else {
    cVar11 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var7._M_head_impl)->ScriptHandler);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (cVar11.__r <= 120.0) goto LAB_0014e9e9;
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SourceDirectory","");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"SourceDirectory","");
    GetCTestConfiguration(&local_1f0,this,&local_1c8);
    this_00 = &((_Var7._M_head_impl)->UpdateHandler).super_cmCTestGenericHandler;
    cmCTestGenericHandler::SetPersistentOption(this_00,local_1a8,local_1f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    uVar2 = (*this_00->_vptr_cmCTestGenericHandler[1])(this_00);
    uVar8 = uVar2 >> 0x1f;
    bVar10 = uVar2 != 0;
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  if ((!bVar10) && ((_Var7._M_head_impl)->TestModel == 2)) {
    return 0;
  }
  if ((_Var7._M_head_impl)->Parts[2].Enabled == true) {
    cVar11 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var7._M_head_impl)->ScriptHandler);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (120.0 < cVar11.__r) {
      iVar3 = (**(code **)((long)((_Var7._M_head_impl)->ConfigureHandler).
                                 super_cmCTestGenericHandler._vptr_cmCTestGenericHandler + 8))
                        (&(_Var7._M_head_impl)->ConfigureHandler);
      uVar8 = uVar8 + (iVar3 >> 0x1f) * -2;
      _Var7._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
  }
  if (((_Var7._M_head_impl)->Parts[3].Enabled == true) &&
     (cVar11 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var7._M_head_impl)->ScriptHandler),
     120.0 < cVar11.__r)) {
    UpdateCTestConfiguration(this);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    iVar3 = (**(code **)(*(long *)&((_Var7._M_head_impl)->BuildHandler).super_cmCTestGenericHandler
                        + 8))(&(_Var7._M_head_impl)->BuildHandler);
    uVar8 = uVar8 + (iVar3 >> 0x1f) * -4;
  }
  _Var7._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (((byte)(bVar1 ^ 1 | (_Var7._M_head_impl)->Parts[4].Enabled) == 1) &&
     (cVar11 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var7._M_head_impl)->ScriptHandler),
     120.0 < cVar11.__r)) {
    UpdateCTestConfiguration(this);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    iVar3 = (**(code **)(*(long *)&((_Var7._M_head_impl)->TestHandler).super_cmCTestGenericHandler +
                        8))(&(_Var7._M_head_impl)->TestHandler);
    uVar8 = uVar8 + (iVar3 >> 0x1f) * -8;
  }
  _Var7._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (((_Var7._M_head_impl)->Parts[5].Enabled == true) &&
     (cVar11 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var7._M_head_impl)->ScriptHandler),
     120.0 < cVar11.__r)) {
    UpdateCTestConfiguration(this);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    uVar2 = (**(code **)(*(long *)&((_Var7._M_head_impl)->CoverageHandler).
                                   super_cmCTestGenericHandler + 8))
                      (&(_Var7._M_head_impl)->CoverageHandler);
    uVar8 = (uVar2 >> 0x1a & 0xffffffe0) + uVar8;
  }
  _Var7._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (((_Var7._M_head_impl)->Parts[6].Enabled == true) &&
     (cVar11 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var7._M_head_impl)->ScriptHandler),
     120.0 < cVar11.__r)) {
    UpdateCTestConfiguration(this);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    uVar2 = (**(code **)(*(long *)&((_Var7._M_head_impl)->MemCheckHandler).super_cmCTestTestHandler
                        + 8))(&(_Var7._M_head_impl)->MemCheckHandler);
    uVar8 = uVar2 >> 0x1b & 0xfffffff0 | uVar8;
  }
  _Var7._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (bVar1 != 0) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    lVar4 = *(long *)&((_Var7._M_head_impl)->BinaryDir)._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,lVar4,((_Var7._M_head_impl)->BinaryDir)._M_string_length + lVar4)
    ;
    std::__cxx11::string::append((char *)local_1a8);
    bVar10 = cmsys::SystemTools::FileIsDirectory(local_1a8);
    if (bVar10) {
      cmsys::Directory::Directory(&local_1d0);
      cmsys::Directory::Load(&local_1d0,local_1a8);
      for (dindex = 0; uVar5 = cmsys::Directory::GetNumberOfFiles(&local_1d0), dindex < uVar5;
          dindex = dindex + 1) {
        cmsys::Directory::GetFile(&local_1d0,dindex);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_1a8[0]._M_dataplus._M_p,
                   local_1a8[0]._M_dataplus._M_p + local_1a8[0]._M_string_length);
        std::__cxx11::string::append((char *)&local_1c8);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0.field_2._8_8_ = plVar6[3];
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        }
        else {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1f0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        bVar10 = cmsys::SystemTools::FileExists(&local_1f0);
        if ((bVar10) && (bVar10 = cmsys::SystemTools::FileIsDirectory(&local_1f0), !bVar10)) {
          _Var7._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          if (((_Var7._M_head_impl)->NotesFiles)._M_string_length != 0) {
            std::__cxx11::string::append((char *)&(_Var7._M_head_impl)->NotesFiles);
            _Var7._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          }
          std::__cxx11::string::_M_append
                    ((char *)&(_Var7._M_head_impl)->NotesFiles,(ulong)local_1f0._M_dataplus._M_p);
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[8].Enabled = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      cmsys::Directory::~Directory(&local_1d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  if ((_Var7._M_head_impl)->Parts[8].Enabled == true) {
    UpdateCTestConfiguration(this);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((_Var7._M_head_impl)->NotesFiles)._M_string_length != 0) {
      GenerateNotesFile(this,((_Var7._M_head_impl)->NotesFiles)._M_dataplus._M_p);
      _Var7._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
  }
  if ((_Var7._M_head_impl)->Parts[7].Enabled == true) {
    UpdateCTestConfiguration(this);
    _Var7._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    iVar3 = (**(code **)(*(long *)&((_Var7._M_head_impl)->SubmitHandler).super_cmCTestGenericHandler
                        + 8))(&(_Var7._M_head_impl)->SubmitHandler);
    if (iVar3 < 0) {
      uVar8 = uVar8 | 0x40;
      goto LAB_0014ee27;
    }
  }
  if (uVar8 == 0) {
    return 0;
  }
LAB_0014ee27:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Errors while running CTest",0x1a);
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,7,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x3f8,local_1f0._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return uVar8;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount; p = Part(p + 1)) {
    notest = !this->Impl->Parts[p];
  }
  if (this->Impl->Parts[PartUpdate] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    cmCTestUpdateHandler* uphandler = this->GetUpdateHandler();
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->Impl->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Impl->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    if (this->GetConfigureHandler()->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartBuild] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetBuildHandler()->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Impl->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetTestHandler()->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Impl->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetCoverageHandler()->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetMemCheckHandler()->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->Impl->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->Impl->NotesFiles.empty()) {
            this->Impl->NotesFiles += ";";
          }
          this->Impl->NotesFiles += fullname;
          this->Impl->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Impl->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->Impl->NotesFiles.empty()) {
      this->GenerateNotesFile(this->Impl->NotesFiles.c_str());
    }
  }
  if (this->Impl->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetSubmitHandler()->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
  }
  return res;
}